

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers_impl.h
# Opt level: O2

bool __thiscall
basisu::elemental_vector::increase_capacity
          (elemental_vector *this,uint32_t min_new_capacity,bool grow_hint,uint32_t element_size,
          object_mover pMover,bool nofail)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  uint uVar4;
  char *pcVar5;
  size_t __size;
  ulong val;
  char buf [256];
  
  if (this->m_capacity < this->m_size) {
    pcVar5 = "m_size <= m_capacity";
    uVar4 = 0xc;
  }
  else {
    val = (ulong)min_new_capacity;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = CONCAT44(0,element_size);
    if (val < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x400000000)) / auVar1,0)) {
      if (min_new_capacity <= this->m_capacity) {
        return true;
      }
      uVar2 = val;
      if ((grow_hint) &&
         (uVar4 = min_new_capacity - (min_new_capacity >> 1 & 0x55555555),
         uVar4 = (uVar4 >> 2 & 0x33333333) + (uVar4 & 0x33333333),
         1 < ((uVar4 >> 4) + uVar4 & 0xf0f0f0f) * 0x1010101 >> 0x18)) {
        uVar2 = helpers::next_pow2(val);
        if ((uVar2 == 0) || (uVar2 <= this->m_capacity)) {
          pcVar5 = "new_capacity && (new_capacity > m_capacity)";
          uVar4 = 0x1b;
          goto LAB_0011f0b6;
        }
        if (uVar2 < val) {
          if (nofail) {
            return false;
          }
          fwrite("vector too large\n",0x11,1,_stderr);
          abort();
        }
      }
      __size = CONCAT44(0,element_size) * uVar2;
      if (pMover == (object_mover)0x0) {
        pvVar3 = realloc(this->m_p,__size);
        if (pvVar3 != (void *)0x0) goto LAB_0011f050;
        if (!nofail) {
          pcVar5 = "vector: realloc() failed allocating %u bytes";
          goto LAB_0011f0dc;
        }
      }
      else {
        pvVar3 = malloc(__size);
        if (pvVar3 != (void *)0x0) {
          (*pMover)(pvVar3,this->m_p,this->m_size);
          free(this->m_p);
LAB_0011f050:
          this->m_p = pvVar3;
          this->m_capacity = (uint32_t)uVar2;
          return true;
        }
        if (!nofail) {
          pcVar5 = "vector: malloc() failed allocating %u bytes";
LAB_0011f0dc:
          snprintf(buf,0x100,pcVar5,__size & 0xffffffff);
          fputs(buf,_stderr);
          abort();
        }
      }
      return false;
    }
    pcVar5 = "min_new_capacity < (0x400000000ULL / element_size)";
    uVar4 = 0xf;
  }
LAB_0011f0b6:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_containers_impl.h"
                ,uVar4,
                "bool basisu::elemental_vector::increase_capacity(uint32_t, bool, uint32_t, object_mover, bool)"
               );
}

Assistant:

bool elemental_vector::increase_capacity(uint32_t min_new_capacity, bool grow_hint, uint32_t element_size, object_mover pMover, bool nofail)
   {
      assert(m_size <= m_capacity);

      if (sizeof(void *) == sizeof(uint64_t))
         assert(min_new_capacity < (0x400000000ULL / element_size));
      else
         assert(min_new_capacity < (0x7FFF0000U / element_size));

      if (m_capacity >= min_new_capacity)
         return true;

      size_t new_capacity = min_new_capacity;
      if ((grow_hint) && (!helpers::is_power_of_2((uint64_t)new_capacity)))
      {
         new_capacity = (size_t)helpers::next_pow2((uint64_t)new_capacity);

         assert(new_capacity && (new_capacity > m_capacity));

         if (new_capacity < min_new_capacity)
         {
            if (nofail)
               return false;
            fprintf(stderr, "vector too large\n");
            abort();
         }
      }
            
      const size_t desired_size = element_size * new_capacity;
      size_t actual_size = 0;
      if (!pMover)
      {
         void* new_p = realloc(m_p, desired_size);
         if (!new_p)
         {
            if (nofail)
               return false;

            char buf[256];
#ifdef _MSC_VER
            sprintf_s(buf, sizeof(buf), "vector: realloc() failed allocating %u bytes", (uint32_t)desired_size);
#else
            snprintf(buf, sizeof(buf), "vector: realloc() failed allocating %u bytes", (uint32_t)desired_size);
#endif
            fprintf(stderr, "%s", buf);
            abort();
         }

#if BASISU_VECTOR_DETERMINISTIC
         actual_size = desired_size;
#elif defined(_MSC_VER)
         actual_size = _msize(new_p);
#elif HAS_MALLOC_USABLE_SIZE
         actual_size = malloc_usable_size(new_p);
#else
         actual_size = desired_size;
#endif
         m_p = new_p;
      }
      else
      {
         void* new_p = malloc(desired_size);
         if (!new_p)
         {
            if (nofail)
               return false;

            char buf[256];
#ifdef _MSC_VER
            sprintf_s(buf, sizeof(buf), "vector: malloc() failed allocating %u bytes", (uint32_t)desired_size);
#else
            snprintf(buf, sizeof(buf), "vector: malloc() failed allocating %u bytes", (uint32_t)desired_size);
#endif
            fprintf(stderr, "%s", buf);
            abort();
         }

#if BASISU_VECTOR_DETERMINISTIC
         actual_size = desired_size;
#elif defined(_MSC_VER)
         actual_size = _msize(new_p);
#elif HAS_MALLOC_USABLE_SIZE
         actual_size = malloc_usable_size(new_p);
#else
         actual_size = desired_size;
#endif

         (*pMover)(new_p, m_p, m_size);

         if (m_p)
            free(m_p);
         
         m_p = new_p;
      }

      if (actual_size > desired_size)
         m_capacity = static_cast<uint32_t>(actual_size / element_size);
      else
         m_capacity = static_cast<uint32_t>(new_capacity);

      return true;
   }